

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
MemoryAccountant::createCacheSizeNodes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountant *in_RDX;
  MemoryAccountantAllocationNode *in_RDI;
  MemoryAccountantAllocationNode *lastNode;
  size_t i;
  MemoryAccountant *in_stack_ffffffffffffffd8;
  size_t size;
  MemoryAccountant *this_00;
  
  for (this_00 = (MemoryAccountant *)0x0; this_00 < in_RDX;
      this_00 = (MemoryAccountant *)((long)&this_00->head_ + 1)) {
    findOrCreateNodeOfSize(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  }
  if (in_RDI->size_ == 0) {
    pMVar1 = createNewAccountantAllocationNode(this_00,(size_t)in_stack_ffffffffffffffd8,in_RDI);
    in_RDI->size_ = (size_t)pMVar1;
  }
  else {
    for (size = in_RDI->size_; size != 0; size = *(size_t *)(size + 0x28)) {
      if (*(long *)(size + 0x28) == 0) {
        pMVar1 = createNewAccountantAllocationNode(this_00,size,in_RDI);
        *(MemoryAccountantAllocationNode **)(size + 0x28) = pMVar1;
        return;
      }
    }
  }
  return;
}

Assistant:

void MemoryAccountant::createCacheSizeNodes(size_t sizes[], size_t length)
{
    for (size_t i = 0; i < length; i++)
        findOrCreateNodeOfSize(sizes[i]);

    if (head_ == NULLPTR)
        head_ = createNewAccountantAllocationNode(0, NULLPTR);
    else {
        for (MemoryAccountantAllocationNode* lastNode = head_; lastNode; lastNode = lastNode->next_) {
            if (lastNode->next_ == NULLPTR) {
                lastNode->next_ = createNewAccountantAllocationNode(0, NULLPTR);
                break;
            }
        }
    }
}